

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::pathChanged(QFileDialogPrivate *this,QString *newPath)

{
  QList<QFileDialogPrivate::HistoryItem> *this_00;
  long lVar1;
  QWidget *this_01;
  QSidebar *this_02;
  QFileDialogComboBox *pQVar2;
  long lVar3;
  Data *pDVar4;
  bool enable;
  byte bVar5;
  int iVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QStringView QVar8;
  HistoryItem local_88;
  QArrayData *local_58;
  QString *pQStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  this_01 = (QWidget *)((this->qFileDialogUi).d)->toParentButton;
  QFileSystemModel::rootPath();
  enable = (bool)QFileInfo::exists((QString *)&local_88);
  QWidget::setEnabled(this_01,enable);
  if (&(local_88.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.path.d.d)->super_QArrayData,2,0x10);
    }
  }
  this_02 = ((this->qFileDialogUi).d)->sidebar;
  QUrl::fromLocalFile((QString *)&local_88);
  QSidebar::selectUrl(this_02,(QUrl *)&local_88);
  QUrl::~QUrl((QUrl *)&local_88);
  pQVar2 = ((this->qFileDialogUi).d)->lookInCombo;
  local_88.path.d.d = (Data *)(pQVar2->m_history).d.d;
  local_88.path.d.ptr = (char16_t *)(pQVar2->m_history).d.ptr;
  local_88.path.d.size = (pQVar2->m_history).d.size;
  if ((QArrayData *)local_88.path.d.d != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)local_88.path.d.d)->ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((QArrayData *)local_88.path.d.d)->ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar1 = *(long *)(lVar1 + 8);
  lVar3 = *(long *)(lVar1 + 0x370);
  if (lVar3 != 0 && *(char *)(lVar1 + 0x2c8) == '\0') {
    QFileDialogComboBox::setHistory
              (*(QFileDialogComboBox **)(lVar3 + 0x18),(QStringList *)&local_88);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QDir::toNativeSeparators((QString *)&local_58);
  if (-1 < (long)this->currentHistoryLocation) {
    this_00 = &this->currentHistory;
    QList<QFileDialogPrivate::HistoryItem>::value
              (&local_88,this_00,(long)this->currentHistoryLocation);
    bVar5 = 1;
    if ((undefined1 *)local_88.path.d.size == local_48) {
      QVar7.m_data = (storage_type_conflict *)pQStack_50;
      QVar7.m_size = local_88.path.d.size;
      QVar8.m_data = local_88.path.d.ptr;
      QVar8.m_size = local_88.path.d.size;
      bVar5 = QtPrivate::equalStrings(QVar8,QVar7);
      bVar5 = bVar5 ^ 1;
    }
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_88.selection.d);
    if (&(local_88.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_88.path.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar6 = this->currentHistoryLocation;
    if (bVar5 == 0) goto LAB_004e8aaa;
    if (-1 < iVar6) {
      saveHistorySelection(this);
      while ((-1 < this->currentHistoryLocation &&
             ((ulong)(this->currentHistoryLocation + 1) < (ulong)(this->currentHistory).d.size))) {
        pDVar4 = (this_00->d).d;
        if ((pDVar4 == (Data *)0x0) ||
           (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<QFileDialogPrivate::HistoryItem>::reallocateAndGrow
                    (&this_00->d,GrowsAtEnd,0,
                     (QArrayDataPointer<QFileDialogPrivate::HistoryItem> *)0x0);
        }
        QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::eraseLast
                  ((QGenericArrayOps<QFileDialogPrivate::HistoryItem> *)this_00);
      }
    }
  }
  local_88.path.d.d = (Data *)local_58;
  local_88.path.d.ptr = (char16_t *)pQStack_50;
  local_88.path.d.size = (qsizetype)local_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88.selection.d.d = (Data *)0x0;
  local_88.selection.d.ptr = (QPersistentModelIndex *)0x0;
  local_88.selection.d.size = 0;
  QtPrivate::QGenericArrayOps<QFileDialogPrivate::HistoryItem>::
  emplace<QFileDialogPrivate::HistoryItem>
            ((QGenericArrayOps<QFileDialogPrivate::HistoryItem> *)&this->currentHistory,
             (this->currentHistory).d.size,&local_88);
  QList<QFileDialogPrivate::HistoryItem>::end(&this->currentHistory);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_88.selection.d);
  if (&(local_88.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.path.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar6 = this->currentHistoryLocation + 1;
  this->currentHistoryLocation = iVar6;
LAB_004e8aaa:
  QWidget::setEnabled((QWidget *)((this->qFileDialogUi).d)->forwardButton,
                      1 < (this->currentHistory).d.size - (long)iVar6);
  QWidget::setEnabled((QWidget *)((this->qFileDialogUi).d)->backButton,
                      0 < this->currentHistoryLocation);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::pathChanged(const QString &newPath)
{
    Q_Q(QFileDialog);
    qFileDialogUi->toParentButton->setEnabled(QFileInfo::exists(model->rootPath()));
    qFileDialogUi->sidebar->selectUrl(QUrl::fromLocalFile(newPath));
    q->setHistory(qFileDialogUi->lookInCombo->history());

    const QString newNativePath = QDir::toNativeSeparators(newPath);

    // equal paths indicate this was invoked by _q_navigateBack/Forward()
    if (currentHistoryLocation < 0 || currentHistory.value(currentHistoryLocation).path != newNativePath) {
        if (currentHistoryLocation >= 0)
            saveHistorySelection();
        while (currentHistoryLocation >= 0 && currentHistoryLocation + 1 < currentHistory.size()) {
            currentHistory.removeLast();
        }
        currentHistory.append({newNativePath, PersistentModelIndexList()});
        ++currentHistoryLocation;
    }
    qFileDialogUi->forwardButton->setEnabled(currentHistory.size() - currentHistoryLocation > 1);
    qFileDialogUi->backButton->setEnabled(currentHistoryLocation > 0);
}